

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O3

int Abc_NodeIsExor(Abc_Obj_t *pNode)

{
  int nVars;
  word wVar1;
  word wVar2;
  
  nVars = (pNode->vFanins).nSize;
  if (nVars - 7U < 0xfffffffc) {
    return 0;
  }
  wVar1 = Hop_ManComputeTruth6
                    ((Hop_Man_t *)pNode->pNtk->pManFunc,(Hop_Obj_t *)(pNode->field_5).pData,nVars);
  if ((long)wVar1 < 0x6666666666666666) {
    if ((long)wVar1 < -0x6996699669966997) {
      if (wVar1 == 0x9669699669969669) {
        return 1;
      }
      wVar2 = 0x9669699696696996;
    }
    else {
      if (wVar1 == 0x9669966996699669) {
        return 1;
      }
      if (wVar1 == 0x9696969696969696) {
        return 1;
      }
      wVar2 = 0x9999999999999999;
    }
  }
  else if ((long)wVar1 < 0x6996699669966996) {
    if (wVar1 == 0x6666666666666666) {
      return 1;
    }
    wVar2 = 0x6969696969696969;
  }
  else {
    if (wVar1 == 0x6996699669966996) {
      return 1;
    }
    if (wVar1 == 0x6996966969969669) {
      return 1;
    }
    wVar2 = 0x6996966996696996;
  }
  if (wVar1 == wVar2) {
    return 1;
  }
  return 0;
}

Assistant:

int Abc_NodeIsExor( Abc_Obj_t * pNode )
{
    Hop_Man_t * pMan;
    word Truth;
    if ( Abc_ObjFaninNum(pNode) < 3 || Abc_ObjFaninNum(pNode) > 6 )
        return 0;
    pMan = (Hop_Man_t *)pNode->pNtk->pManFunc;
    Truth = Hop_ManComputeTruth6( pMan, (Hop_Obj_t *)pNode->pData, Abc_ObjFaninNum(pNode) );
    if ( Truth == 0x6666666666666666 || Truth == 0x9999999999999999 || 
         Truth == 0x9696969696969696 || Truth == 0x6969696969696969 || 
         Truth == 0x6996699669966996 || Truth == 0x9669966996699669 || 
         Truth == 0x9669699696696996 || Truth == 0x6996966969969669 ||
         Truth == 0x6996966996696996 || Truth == 0x9669699669969669 )
         return 1;
    return 0;
}